

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLiberty.c
# Opt level: O1

Amap_Item_t * Amap_LibertyCellArea(Amap_Tree_t *p,Amap_Item_t *pCell)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  Amap_Pair_t AVar4;
  int iVar5;
  Amap_Item_t *pAVar6;
  
  uVar1 = pCell->Child;
  iVar2 = p->nItems;
  if ((int)uVar1 < iVar2) {
    if ((int)uVar1 < 0) {
      pAVar6 = (Amap_Item_t *)0x0;
    }
    else {
      pAVar6 = p->pItems + uVar1;
    }
    if (pAVar6 != (Amap_Item_t *)0x0) {
      pcVar3 = p->pContents;
      do {
        AVar4 = pAVar6->Key;
        iVar5 = strncmp(pcVar3 + AVar4.Beg,"area",(long)AVar4 - ((long)AVar4 << 0x20) >> 0x20);
        if (iVar5 == 0) {
          return pAVar6;
        }
        uVar1 = pAVar6->Next;
        if (iVar2 <= (int)uVar1) goto LAB_003c326d;
        if ((int)uVar1 < 0) {
          pAVar6 = (Amap_Item_t *)0x0;
        }
        else {
          pAVar6 = p->pItems + uVar1;
        }
      } while (pAVar6 != (Amap_Item_t *)0x0);
    }
    return (Amap_Item_t *)0x0;
  }
LAB_003c326d:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/amap/amapLiberty.c"
                ,0x49,"Amap_Item_t *Amap_LibertyItem(Amap_Tree_t *, int)");
}

Assistant:

Amap_Item_t * Amap_LibertyCellArea( Amap_Tree_t * p, Amap_Item_t * pCell )
{
    Amap_Item_t * pArea;
    Amap_ItemForEachChild( p, pCell, pArea )
    {
        if ( Amap_LibertyCompare(p, pArea->Key, "area") )
            continue;
        return pArea;
    }
    return NULL;
}